

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::XThreadEvent::XThreadEvent
          (XThreadEvent *this,ExceptionOrValue *result,Executor *targetExecutor,EventLoop *loop,
          void *funcTracePtr,SourceLocation location)

{
  void *funcTracePtr_local;
  EventLoop *loop_local;
  Executor *targetExecutor_local;
  ExceptionOrValue *result_local;
  XThreadEvent *this_local;
  
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  Event::Event(&this->super_Event,loop,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0059ec70;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0059ecc0;
  this->result = result;
  this->funcTracePtr = funcTracePtr;
  (**targetExecutor->_vptr_Executor)();
  Maybe<const_kj::Executor_&>::Maybe(&this->replyExecutor);
  Maybe<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::Maybe(&this->promiseNode);
  ListLink<kj::_::XThreadEvent>::ListLink(&this->targetLink);
  this->state = UNUSED;
  ListLink<kj::_::XThreadEvent>::ListLink(&this->replyLink);
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  return;
}

Assistant:

XThreadEvent::XThreadEvent(
    ExceptionOrValue& result, const Executor& targetExecutor, EventLoop& loop,
    void* funcTracePtr, SourceLocation location)
    : Event(loop, location), result(result), funcTracePtr(funcTracePtr),
      targetExecutor(targetExecutor.addRef()) {}